

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_do_button_image(nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_image img,
                          nk_button_behavior b,nk_style_button *style,nk_input *in)

{
  nk_rect r;
  nk_bool nVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  nk_rect local_50;
  nk_rect local_40;
  
  nVar1 = 0;
  if (((state != (nk_flags *)0x0) && (nVar1 = 0, out != (nk_command_buffer *)0x0)) &&
     (style != (nk_style_button *)0x0)) {
    local_40 = bounds;
    nVar1 = nk_do_button(state,out,bounds,style,in,b,&local_50);
    fVar5 = local_50.w;
    fVar2 = (style->image_padding).x;
    fVar4 = local_50.y;
    local_50.x = local_50.x + fVar2;
    fVar3 = (style->image_padding).y;
    local_50.y = fVar4 + fVar3;
    local_50.h = local_50.h - (fVar3 + fVar3);
    local_50.w = fVar5 - (fVar2 + fVar2);
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    }
    nk_draw_button(out,&local_40,*state,style);
    r.w = local_50.w;
    r.h = local_50.h;
    r.x = local_50.x;
    r.y = local_50.y;
    nk_draw_image(out,r,&img,(nk_color)0xffffffff);
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
  }
  return nVar1;
}

Assistant:

NK_LIB nk_bool
nk_do_button_image(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect bounds,
struct nk_image img, enum nk_button_behavior b,
const struct nk_style_button *style, const struct nk_input *in)
{
int ret;
struct nk_rect content;

NK_ASSERT(state);
NK_ASSERT(style);
NK_ASSERT(out);
if (!out || !style || !state)
return nk_false;

ret = nk_do_button(state, out, bounds, style, in, b, &content);
content.x += style->image_padding.x;
content.y += style->image_padding.y;
content.w -= 2 * style->image_padding.x;
content.h -= 2 * style->image_padding.y;

if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_button_image(out, &bounds, &content, *state, style, &img);
if (style->draw_end) style->draw_end(out, style->userdata);
return ret;
}